

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_head.c
# Opt level: O2

ufile_error ufile_head(char *bucket_name,char *key,ufile_file_info *info)

{
  uint uVar1;
  CURL *curl;
  char *pcVar2;
  ulong uVar3;
  ufile_error uVar4;
  http_options opt;
  
  uVar4 = check_bucket_key(bucket_name,key);
  pcVar2 = uVar4.message;
  uVar1 = uVar4.code;
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0 || uVar1 - 200 < 100) {
    curl = (CURL *)curl_easy_init();
    if (curl == (CURL *)0x0) {
      pcVar2 = "init curl failed.";
      uVar3 = 0xffffffffffffffec;
    }
    else {
      uVar4 = set_http_options(&opt,"HEAD","",bucket_name,key,(char *)0x0);
      pcVar2 = uVar4.message;
      uVar1 = uVar4.code;
      if (uVar1 == 0 || uVar1 - 200 < 100) {
        set_curl_options(curl,&opt);
        curl_easy_setopt(curl,0x4e6f,head_header_cb);
        curl_easy_setopt(curl,0x272d,info);
        curl_easy_setopt(curl,0x2c,1);
        uVar4 = curl_do(curl);
        pcVar2 = uVar4.message;
        uVar1 = uVar4.code;
      }
      uVar3 = (ulong)uVar1;
      http_cleanup(curl,&opt);
    }
  }
  uVar4._0_8_ = uVar3 & 0xffffffff;
  uVar4.message = pcVar2;
  return uVar4;
}

Assistant:

struct ufile_error
ufile_head(const char* bucket_name, const char *key, struct ufile_file_info *info){
    struct ufile_error error = NO_ERROR;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }

    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }

    struct http_options opt;
    error = set_http_options(&opt, "HEAD", "", bucket_name, key, NULL);
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt);
        return error;
    }

    set_curl_options(curl, &opt);
    curl_easy_setopt(curl, CURLOPT_HEADERFUNCTION, head_header_cb);
    curl_easy_setopt(curl, CURLOPT_HEADERDATA, (void *)info);
    curl_easy_setopt(curl, CURLOPT_NOBODY, 1);

    error = curl_do(curl);
    http_cleanup(curl, &opt);
    return error;
}